

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantSetSuppStart(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  if (iVar1 != 1) {
    __assert_fail("Gia_ManObjNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x66,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
  }
  if (p->vSuppWords == (Vec_Wrd_t *)0x0) {
    iVar1 = Vec_IntSize(&p->vSuppVars);
    if (iVar1 == 0) {
      p->iSuppPi = 0;
      p->nSuppWords = 1;
      pVVar2 = Vec_WrdAlloc(1000);
      p->vSuppWords = pVVar2;
      Vec_WrdPush(p->vSuppWords,0);
      return;
    }
    __assert_fail("Vec_IntSize(&p->vSuppVars) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x68,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
  }
  __assert_fail("p->vSuppWords == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                ,0x67,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
}

Assistant:

void Gia_ManQuantSetSuppStart( Gia_Man_t * p )
{
    assert( Gia_ManObjNum(p) == 1 );
    assert( p->vSuppWords == NULL );
    assert( Vec_IntSize(&p->vSuppVars) == 0 );
    p->iSuppPi    = 0;
    p->nSuppWords = 1;
    p->vSuppWords = Vec_WrdAlloc( 1000 );
    Vec_WrdPush( p->vSuppWords, 0 );
}